

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult gt_counter_access(CPUARMState_conflict *env,int timeridx,_Bool isread)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint64_t hcr;
  _Bool secure;
  uint cur_el;
  _Bool isread_local;
  int timeridx_local;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  _Var1 = arm_is_secure(env);
  uVar4 = arm_hcr_el2_eff_aarch64(env);
  if (iVar2 == 0) {
    if ((uVar4 & 0x408000000) == 0x408000000) {
      uVar3 = extract32((env->cp15).cnthctl_el2,timeridx,1);
      if (uVar3 == 0) {
        return CP_ACCESS_TRAP_EL2;
      }
      return CP_ACCESS_OK;
    }
    uVar3 = extract32((uint32_t)(env->cp15).c14_cntkctl,timeridx,1);
    if (uVar3 == 0) {
      return CP_ACCESS_TRAP;
    }
    if ((uVar4 & 0x400000000) == 0) {
      iVar2 = arm_feature(env,0x20);
      if ((((iVar2 != 0) && (timeridx == 0)) && (!_Var1)) &&
         (uVar3 = extract32((env->cp15).cnthctl_el2,1,1), uVar3 == 0)) {
        return CP_ACCESS_TRAP_EL2;
      }
    }
    else if ((timeridx == 0) && (uVar3 = extract32((env->cp15).cnthctl_el2,10,1), uVar3 == 0)) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  else if (((iVar2 == 1) && (iVar2 = arm_feature(env,0x20), iVar2 != 0)) &&
          ((timeridx == 0 && (!_Var1)))) {
    if ((uVar4 & 0x400000000) == 0) {
      uVar3 = extract32((env->cp15).cnthctl_el2,0,1);
    }
    else {
      uVar3 = extract32((env->cp15).cnthctl_el2,10,1);
    }
    if (uVar3 == 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult gt_counter_access(CPUARMState *env, int timeridx,
                                        bool isread)
{
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    uint64_t hcr = arm_hcr_el2_eff(env);

    switch (cur_el) {
    case 0:
        /* If HCR_EL2.<E2H,TGE> == '11': check CNTHCTL_EL2.EL0[PV]CTEN. */
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            return (extract32(env->cp15.cnthctl_el2, timeridx, 1)
                    ? CP_ACCESS_OK : CP_ACCESS_TRAP_EL2);
        }

        /* CNT[PV]CT: not visible from PL0 if EL0[PV]CTEN is zero */
        if (!extract32(env->cp15.c14_cntkctl, timeridx, 1)) {
            return CP_ACCESS_TRAP;
        }

        /* If HCR_EL2.<E2H,TGE> == '10': check CNTHCTL_EL2.EL1PCTEN. */
        if (hcr & HCR_E2H) {
            if (timeridx == GTIMER_PHYS &&
                !extract32(env->cp15.cnthctl_el2, 10, 1)) {
                return CP_ACCESS_TRAP_EL2;
            }
        } else {
            /* If HCR_EL2.<E2H> == 0: check CNTHCTL_EL2.EL1PCEN. */
            if (arm_feature(env, ARM_FEATURE_EL2) &&
                timeridx == GTIMER_PHYS && !secure &&
                !extract32(env->cp15.cnthctl_el2, 1, 1)) {
                return CP_ACCESS_TRAP_EL2;
            }
        }
        break;

    case 1:
        /* Check CNTHCTL_EL2.EL1PCTEN, which changes location based on E2H. */
        if (arm_feature(env, ARM_FEATURE_EL2) &&
            timeridx == GTIMER_PHYS && !secure &&
            (hcr & HCR_E2H
             ? !extract32(env->cp15.cnthctl_el2, 10, 1)
             : !extract32(env->cp15.cnthctl_el2, 0, 1))) {
            return CP_ACCESS_TRAP_EL2;
        }
        break;
    }
    return CP_ACCESS_OK;
}